

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_BitwiseXor(BitwiseXorForm1 BitwiseXor)

{
  bool bVar1;
  Image output;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  ImageTemplate<unsigned_char> local_68;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  Unit_Test::intensityArray(&local_28,2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&local_40,&local_28,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  (*BitwiseXor)(&local_68,
                local_40.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
                local_40.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
  if (((((local_40.
          super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_height == local_68._height) &&
       ((local_40.
         super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_width == local_68._width)) &&
      ((local_40.
        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_alignment == local_68._alignment)) &&
     (((local_40.
        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_colorCount == local_68._colorCount &&
      ((local_40.
        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_rowSize == local_68._rowSize)))) {
    bVar1 = Unit_Test::verifyImage
                      (&local_68,
                       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[1] ^
                       *local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar1 = false;
  }
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_40);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form1_BitwiseXor(BitwiseXorForm1 BitwiseXor)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const PenguinV_Image::Image output = BitwiseXor( input[0], input[1] );

        return equalSize( input[0], output ) && verifyImage( output, intensity[0] ^ intensity[1] );
    }